

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QList<QGraphicsTransform_*> * __thiscall
QGraphicsItem::transformations
          (QList<QGraphicsTransform_*> *__return_storage_ptr__,QGraphicsItem *this)

{
  TransformData *pTVar1;
  
  pTVar1 = ((this->d_ptr).d)->transformData;
  if (pTVar1 == (TransformData *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QGraphicsTransform **)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<QGraphicsTransform_*>::QArrayDataPointer
              (&__return_storage_ptr__->d,&(pTVar1->graphicsTransforms).d);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QGraphicsTransform *> QGraphicsItem::transformations() const
{
    if (!d_ptr->transformData)
        return QList<QGraphicsTransform *>();
    return d_ptr->transformData->graphicsTransforms;
}